

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O1

void run_centers_task(parallel_task_1d *task,size_t thread_id)

{
  undefined8 uVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  float in_XMM1_Da;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar7;
  
  uVar5 = (task->range).begin;
  uVar2 = (task->range).end;
  if (uVar5 < uVar2) {
    lVar4 = uVar5 * 0xc + 8;
    do {
      uVar6 = (*task[1].work_item.work_fn)(task[1].work_item.next,uVar5);
      fVar7 = (float)((ulong)uVar6 >> 0x20);
      fVar12 = (float)uVar6;
      sVar3 = task[1].range.begin;
      *(undefined8 *)((sVar3 - 8) + lVar4) = uVar6;
      *(float *)(sVar3 + lVar4) = in_XMM1_Da;
      sVar3 = task[1].range.end;
      uVar6 = *(undefined8 *)(sVar3 + thread_id * 0x18);
      fVar10 = *(float *)(sVar3 + 8 + thread_id * 0x18);
      uVar1 = *(undefined8 *)(sVar3 + 0xc + thread_id * 0x18);
      fVar13 = *(float *)(sVar3 + 0x14 + thread_id * 0x18);
      fVar8 = (float)uVar6;
      if (fVar12 <= fVar8) {
        fVar8 = fVar12;
      }
      fVar9 = (float)((ulong)uVar6 >> 0x20);
      fVar11 = (float)uVar1;
      if (fVar11 <= fVar12) {
        fVar11 = fVar12;
      }
      if (fVar7 <= fVar9) {
        fVar9 = fVar7;
      }
      if (in_XMM1_Da <= fVar10) {
        fVar10 = in_XMM1_Da;
      }
      fVar12 = (float)((ulong)uVar1 >> 0x20);
      if (fVar12 <= fVar7) {
        fVar12 = fVar7;
      }
      if (fVar13 <= in_XMM1_Da) {
        fVar13 = in_XMM1_Da;
      }
      *(ulong *)(sVar3 + thread_id * 0x18) = CONCAT44(fVar9,fVar8);
      *(float *)(sVar3 + 8 + thread_id * 0x18) = fVar10;
      *(ulong *)(sVar3 + 0xc + thread_id * 0x18) = CONCAT44(fVar12,fVar11);
      *(float *)(sVar3 + 0x14 + thread_id * 0x18) = fVar13;
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0xc;
    } while (uVar2 != uVar5);
  }
  return;
}

Assistant:

static void run_centers_task(struct parallel_task_1d* task, size_t thread_id) {
    struct centers_task* centers_task = (void*)task;
    for (size_t i = task->range.begin, n = task->range.end; i < n; ++i) {
        struct vec3 center = centers_task->center_fn(centers_task->primitive_data, i);
        centers_task->centers[i] = center;
        centers_task->center_bboxes[thread_id] = extend_bbox(centers_task->center_bboxes[thread_id], center);
    }
}